

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_20b0ad::ReaderThread::run(ReaderThread *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long in_RDI;
  int i;
  int num;
  undefined4 local_10;
  
  Imf_3_2::RgbaInputFile::header();
  lVar3 = Imf_3_2::Header::dataWindow();
  iVar1 = *(int *)(lVar3 + 0xc);
  Imf_3_2::RgbaInputFile::header();
  lVar3 = Imf_3_2::Header::dataWindow();
  iVar2 = *(int *)(lVar3 + 4);
  for (local_10 = *(int *)(in_RDI + 0x18); local_10 < (iVar1 - iVar2) + 1;
      local_10 = *(int *)(in_RDI + 0x1c) + local_10) {
    Imf_3_2::RgbaInputFile::readPixels((int)*(undefined8 *)(in_RDI + 0x10));
  }
  IlmThread_3_2::Semaphore::post();
  return;
}

Assistant:

void
ReaderThread::run ()
{

    int num = _infile->header ().dataWindow ().max.y -
              _infile->header ().dataWindow ().min.y + 1;

    for (int i = _start; i < num; i += _step)
        _infile->readPixels (i);

    //
    // Signal that the thread has finished
    //

    threadSemaphore.post ();
}